

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

void __thiscall TypeOpReturn::TypeOpReturn(TypeOpReturn *this,TypeFactory *t)

{
  OpBehavior *pOVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"return",&local_31);
  TypeOp::TypeOp(&this->super_TypeOp,t,CPUI_RETURN,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_TypeOp)._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003f28a0;
  (this->super_TypeOp).opflags = 0x20018;
  pOVar1 = (OpBehavior *)operator_new(0x10);
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003fe0a0;
  pOVar1->opcode = CPUI_RETURN;
  pOVar1->isunary = false;
  pOVar1->isspecial = true;
  (this->super_TypeOp).behave = pOVar1;
  return;
}

Assistant:

TypeOpReturn::TypeOpReturn(TypeFactory *t) : TypeOp(t,CPUI_RETURN,"return")

{
  opflags = PcodeOp::special|PcodeOp::returns|PcodeOp::nocollapse;
  behave = new OpBehavior(CPUI_RETURN,false,true); // Dummy behavior
}